

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

ssize_t add_to_tmp_buffer(FFSBuffer buf,size_t size)

{
  long lVar1;
  void *ptr;
  ulong uVar2;
  long lVar3;
  size_t s;
  ulong s_00;
  
  uVar2 = buf->tmp_buffer_size;
  lVar1 = buf->tmp_buffer_in_use_size;
  s_00 = size + lVar1;
  lVar3 = -1;
  if ((long)uVar2 < 0) {
    if (-uVar2 < s_00) {
      return -1;
    }
    ptr = buf->tmp_buffer;
  }
  else {
    if (uVar2 == 0) {
      s = 0x400;
      if (0x400 < s_00) {
        s = s_00;
      }
      ptr = ffs_malloc(s);
      buf->tmp_buffer = ptr;
      uVar2 = buf->tmp_buffer_size;
    }
    else {
      ptr = buf->tmp_buffer;
    }
    if (uVar2 < s_00) {
      ptr = ffs_realloc(ptr,s_00);
      buf->tmp_buffer = ptr;
      buf->tmp_buffer_size = s_00;
    }
  }
  if (ptr == (void *)0x0) {
    buf->tmp_buffer_size = 0;
  }
  else {
    buf->tmp_buffer_in_use_size = s_00;
    lVar3 = lVar1;
  }
  return lVar3;
}

Assistant:

static
ssize_t
add_to_tmp_buffer(FFSBuffer buf, size_t size)
{
    ssize_t old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (size_t)(-buf->tmp_buffer_size)) return -1;
    } else {
	if (buf->tmp_buffer_size == 0) {
	    int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	    buf->tmp_buffer = malloc(tmp_size);
	}
	if (size > (size_t)buf->tmp_buffer_size) {
	    buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	    buf->tmp_buffer_size = size;
	}
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
	return -1;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size;
}